

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O2

PCRE2_SPTR16 set_table_bit(pcre2_real_code_16 *re,PCRE2_SPTR16 p,BOOL caseless,BOOL utf)

{
  ushort uVar1;
  
  uVar1 = *p;
  if (uVar1 < 0x100) {
    re->start_bitmap[uVar1 >> 3] = re->start_bitmap[uVar1 >> 3] | (byte)(1 << ((byte)uVar1 & 7));
    if (caseless != 0) {
      re->start_bitmap[re->tables[(ulong)uVar1 + 0x100] >> 3] =
           re->start_bitmap[re->tables[(ulong)uVar1 + 0x100] >> 3] |
           '\x01' << (re->tables[(ulong)uVar1 + 0x100] & 7);
    }
  }
  else {
    re->start_bitmap[0x1f] = re->start_bitmap[0x1f] | 0x80;
  }
  return p + 1;
}

Assistant:

static PCRE2_SPTR
set_table_bit(pcre2_real_code *re, PCRE2_SPTR p, BOOL caseless, BOOL utf)
{
uint32_t c = *p++;   /* First code unit */
(void)utf;           /* Stop compiler warning when UTF not supported */

/* In 16-bit and 32-bit modes, code units greater than 0xff set the bit for
0xff. */

#if PCRE2_CODE_UNIT_WIDTH != 8
if (c > 0xff) SET_BIT(0xff); else
#endif

SET_BIT(c);

/* In UTF-8 or UTF-16 mode, pick up the remaining code units in order to find
the end of the character, even when caseless. */

#ifdef SUPPORT_UNICODE
if (utf)
  {
#if PCRE2_CODE_UNIT_WIDTH == 8
  if (c >= 0xc0) GETUTF8INC(c, p);
#elif PCRE2_CODE_UNIT_WIDTH == 16
  if ((c & 0xfc00) == 0xd800) GETUTF16INC(c, p);
#endif
  }
#endif  /* SUPPORT_UNICODE */

/* If caseless, handle the other case of the character. */

if (caseless)
  {
#ifdef SUPPORT_UNICODE
  if (utf)
    {
#if PCRE2_CODE_UNIT_WIDTH == 8
    PCRE2_UCHAR buff[6];
    c = UCD_OTHERCASE(c);
    (void)PRIV(ord2utf)(c, buff);
    SET_BIT(buff[0]);
#else  /* 16-bit or 32-bit mode */
    c = UCD_OTHERCASE(c);
    if (c > 0xff) SET_BIT(0xff); else SET_BIT(c);
#endif
    }
  else
#endif  /* SUPPORT_UNICODE */

  /* Not UTF */

  if (MAX_255(c)) SET_BIT(re->tables[fcc_offset + c]);
  }

return p;
}